

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_avx2.c
# Opt level: O0

void nn_propagate_8to8(float *inputs,float *weights,float *bias,int num_inputs_to_process,
                      int tot_num_inputs,int num_outputs,float *output_nodes,int is_clip_required)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  int in_ECX;
  int iVar19;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  __m256 ht_1;
  __m256 ht_0;
  __m256 hh1;
  __m256 hh0;
  __m256 mul1;
  __m256 mul0;
  __m256 weight1;
  __m256 weight0;
  int index;
  int i;
  int weight_idx;
  __m256 inputs256;
  int in;
  __m256 in_result;
  __m256 bias_reg;
  int out;
  __m256 hadd [4];
  int local_468;
  int local_424;
  undefined1 local_420 [8];
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  int local_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int local_324;
  int local_320;
  int local_31c;
  long local_318;
  long local_310;
  long local_308;
  ulong uStack_2b8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  
  local_324 = in_R9D;
  local_320 = in_R8D;
  local_31c = in_ECX;
  local_318 = in_RDX;
  local_310 = in_RSI;
  local_308 = in_RDI;
  for (local_3c4 = 0; local_3c4 < local_324; local_3c4 = local_3c4 + 8) {
    puVar17 = (undefined8 *)(local_318 + (long)local_3c4 * 4);
    uVar4 = *puVar17;
    uVar5 = puVar17[1];
    uVar6 = puVar17[2];
    uVar7 = puVar17[3];
    uStack_2b8 = SUB328(ZEXT832(0),4);
    _local_420 = ZEXT832(uStack_2b8) << 0x40;
    for (local_424 = 0; local_140 = local_420._0_4_, fStack_13c = local_420._4_4_,
        fStack_138 = local_420._8_4_, fStack_134 = local_420._12_4_, fStack_130 = local_420._16_4_,
        fStack_12c = local_420._20_4_, fStack_128 = local_420._24_4_, fStack_124 = local_420._28_4_,
        local_424 < local_31c; local_424 = local_424 + 8) {
      puVar17 = (undefined8 *)(local_308 + (long)local_424 * 4);
      uVar8 = *puVar17;
      uVar9 = puVar17[1];
      uVar10 = puVar17[2];
      uVar11 = puVar17[3];
      iVar19 = local_3c4 * local_320;
      for (local_468 = 0; local_468 < 4; local_468 = local_468 + 1) {
        iVar16 = local_424 + iVar19 + local_468 * 2 * local_320;
        puVar17 = (undefined8 *)(local_310 + (long)iVar16 * 4);
        puVar18 = (undefined8 *)(local_310 + (long)(iVar16 + local_320) * 4);
        local_240 = (float)uVar8;
        fStack_23c = (float)((ulong)uVar8 >> 0x20);
        fStack_238 = (float)uVar9;
        fStack_234 = (float)((ulong)uVar9 >> 0x20);
        fStack_230 = (float)uVar10;
        fStack_22c = (float)((ulong)uVar10 >> 0x20);
        fStack_228 = (float)uVar11;
        uStack_224 = (undefined4)((ulong)uVar11 >> 0x20);
        local_260 = (float)*puVar17;
        fStack_25c = (float)((ulong)*puVar17 >> 0x20);
        fStack_258 = (float)puVar17[1];
        fStack_254 = (float)((ulong)puVar17[1] >> 0x20);
        fStack_250 = (float)puVar17[2];
        fStack_24c = (float)((ulong)puVar17[2] >> 0x20);
        fStack_248 = (float)puVar17[3];
        local_2a0 = (float)*puVar18;
        fStack_29c = (float)((ulong)*puVar18 >> 0x20);
        fStack_298 = (float)puVar18[1];
        fStack_294 = (float)((ulong)puVar18[1] >> 0x20);
        fStack_290 = (float)puVar18[2];
        fStack_28c = (float)((ulong)puVar18[2] >> 0x20);
        fStack_288 = (float)puVar18[3];
        auVar15._4_4_ = fStack_23c * fStack_25c;
        auVar15._0_4_ = local_240 * local_260;
        auVar15._12_4_ = fStack_234 * fStack_254;
        auVar15._8_4_ = fStack_238 * fStack_258;
        auVar15._20_4_ = fStack_22c * fStack_24c;
        auVar15._16_4_ = fStack_230 * fStack_250;
        auVar15._28_4_ = uStack_224;
        auVar15._24_4_ = fStack_228 * fStack_248;
        auVar14._4_4_ = fStack_23c * fStack_29c;
        auVar14._0_4_ = local_240 * local_2a0;
        auVar14._12_4_ = fStack_234 * fStack_294;
        auVar14._8_4_ = fStack_238 * fStack_298;
        auVar14._20_4_ = fStack_22c * fStack_28c;
        auVar14._16_4_ = fStack_230 * fStack_290;
        auVar14._28_4_ = uStack_224;
        auVar14._24_4_ = fStack_228 * fStack_288;
        auVar1 = vhaddps_avx(auVar15,auVar14);
        *(undefined1 (*) [32])(&local_3c0 + (long)local_468 * 4) = auVar1;
      }
      auVar13._8_8_ = uStack_3b8;
      auVar13._0_8_ = local_3c0;
      auVar13._16_8_ = uStack_3b0;
      auVar13._24_8_ = uStack_3a8;
      auVar12._8_8_ = uStack_398;
      auVar12._0_8_ = local_3a0;
      auVar12._16_8_ = uStack_390;
      auVar12._24_8_ = uStack_388;
      auVar1 = vhaddps_avx(auVar13,auVar12);
      auVar3._8_8_ = uStack_378;
      auVar3._0_8_ = local_380;
      auVar3._16_8_ = uStack_370;
      auVar3._24_8_ = uStack_368;
      auVar2._8_8_ = uStack_358;
      auVar2._0_8_ = local_360;
      auVar2._16_8_ = uStack_350;
      auVar2._24_8_ = uStack_348;
      auVar2 = vhaddps_avx(auVar3,auVar2);
      auVar3 = vperm2f128_avx(auVar1,auVar2,0x20);
      auVar1 = vperm2f128_avx(auVar1,auVar2,0x31);
      local_c0 = auVar3._0_4_;
      fStack_bc = auVar3._4_4_;
      fStack_b8 = auVar3._8_4_;
      fStack_b4 = auVar3._12_4_;
      fStack_b0 = auVar3._16_4_;
      fStack_ac = auVar3._20_4_;
      fStack_a8 = auVar3._24_4_;
      fStack_a4 = auVar3._28_4_;
      local_e0 = auVar1._0_4_;
      fStack_dc = auVar1._4_4_;
      fStack_d8 = auVar1._8_4_;
      fStack_d4 = auVar1._12_4_;
      fStack_d0 = auVar1._16_4_;
      fStack_cc = auVar1._20_4_;
      fStack_c8 = auVar1._24_4_;
      fStack_c4 = auVar1._28_4_;
      local_420._4_4_ = fStack_13c + fStack_bc + fStack_dc;
      local_420._0_4_ = local_140 + local_c0 + local_e0;
      uStack_418._0_4_ = fStack_138 + fStack_b8 + fStack_d8;
      uStack_418._4_4_ = fStack_134 + fStack_b4 + fStack_d4;
      uStack_410._0_4_ = fStack_130 + fStack_b0 + fStack_d0;
      uStack_410._4_4_ = fStack_12c + fStack_ac + fStack_cc;
      uStack_408._0_4_ = fStack_128 + fStack_a8 + fStack_c8;
      uStack_408._4_4_ = fStack_124 + fStack_a4 + fStack_c4;
    }
    local_160 = (float)uVar4;
    fStack_15c = (float)((ulong)uVar4 >> 0x20);
    fStack_158 = (float)uVar5;
    fStack_154 = (float)((ulong)uVar5 >> 0x20);
    fStack_150 = (float)uVar6;
    fStack_14c = (float)((ulong)uVar6 >> 0x20);
    fStack_148 = (float)uVar7;
    fStack_144 = (float)((ulong)uVar7 >> 0x20);
    local_420._4_4_ = fStack_13c + fStack_15c;
    local_420._0_4_ = local_140 + local_160;
    uStack_418._0_4_ = fStack_138 + fStack_158;
    uStack_418._4_4_ = fStack_134 + fStack_154;
    uStack_410._0_4_ = fStack_130 + fStack_150;
    uStack_410._4_4_ = fStack_12c + fStack_14c;
    uStack_408._0_4_ = fStack_128 + fStack_148;
    uStack_408._4_4_ = fStack_124 + fStack_144;
    auVar1 = _local_420;
    if ((int)output_nodes != 0) {
      uStack_408 = auVar1._24_8_;
      auVar1._16_8_ = uStack_410;
      auVar1._0_16_ = _local_420;
      auVar1._24_8_ = uStack_408;
      _local_420 = vmaxps_avx(auVar1,ZEXT832(0));
    }
    puVar17 = (undefined8 *)(in_stack_00000008 + (long)local_3c4 * 4);
    *puVar17 = local_420;
    puVar17[1] = uStack_418;
    puVar17[2] = uStack_410;
    puVar17[3] = uStack_408;
  }
  return;
}

Assistant:

static inline void nn_propagate_8to8(
    const float *const inputs, const float *const weights,
    const float *const bias, int num_inputs_to_process, int tot_num_inputs,
    int num_outputs, float *const output_nodes, int is_clip_required) {
  __m256 hadd[4];
  for (int out = 0; out < num_outputs; out += 8) {
    __m256 bias_reg = _mm256_loadu_ps(&bias[out]);
    __m256 in_result = _mm256_setzero_ps();
    for (int in = 0; in < num_inputs_to_process; in += 8) {
      const __m256 inputs256 = _mm256_loadu_ps(&inputs[in]);
      const int weight_idx = in + (out * tot_num_inputs);
      // Process two output rows at a time.
      for (int i = 0; i < 4; i++) {
        CALC_OUTPUT_FOR_2ROWS
      }
      const __m256 hh0 = _mm256_hadd_ps(hadd[0], hadd[1]);
      const __m256 hh1 = _mm256_hadd_ps(hadd[2], hadd[3]);

      __m256 ht_0 = _mm256_permute2f128_ps(hh0, hh1, 0x20);
      __m256 ht_1 = _mm256_permute2f128_ps(hh0, hh1, 0x31);

      __m256 result = _mm256_add_ps(ht_0, ht_1);
      in_result = _mm256_add_ps(in_result, result);
    }
    in_result = _mm256_add_ps(in_result, bias_reg);
    if (is_clip_required)
      in_result = _mm256_max_ps(in_result, _mm256_setzero_ps());
    _mm256_storeu_ps(&output_nodes[out], in_result);
  }
}